

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int lws_system_do_attach(lws_context_per_thread *pt)

{
  int iVar1;
  void *local_20;
  lws_attach_item *item;
  lws_context_per_thread *pt_local;
  
  item = (lws_attach_item *)pt;
  while( true ) {
    if (*(int *)&item[1].list.owner == 0) {
      return 0;
    }
    if ((item[6].list.prev[0x30].next)->owner == (lws_dll2_owner *)0x0) {
      __assert_fail("pt->context->system_ops->attach",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/system/system.c"
                    ,0xe3,"int lws_system_do_attach(struct lws_context_per_thread *)");
    }
    if ((item[6].list.prev[0x30].next)->owner == (lws_dll2_owner *)0x0) {
      _lws_log(1,"%s: define (*attach)\n","lws_system_do_attach");
      return 1;
    }
    iVar1 = (*(code *)(item[6].list.prev[0x30].next)->owner)
                      (item[6].list.prev,*(undefined1 *)((long)&item[8].list.prev + 6),0,0,0,
                       &local_20);
    if (iVar1 != 0) break;
    if (local_20 == (void *)0x0) {
      return 0;
    }
    (**(code **)((long)local_20 + 0x18))
              (item[6].list.prev,*(undefined1 *)((long)&item[8].list.prev + 6),
               *(undefined8 *)((long)local_20 + 0x20));
    lws_realloc(local_20,0,"lws_free");
  }
  _lws_log(1,"%s: attach problem\n","lws_system_do_attach");
  return 1;
}

Assistant:

int
lws_system_do_attach(struct lws_context_per_thread *pt)
{
	/*
	 * If nothing to do, we just return immediately
	 */

	while (pt->attach_owner.count) {

		struct lws_attach_item *item;

		/*
		 * If anybody used the attach apis, there must be an
		 * implementation of the (*attach) lws_system op function
		 */

		assert(pt->context->system_ops->attach);
		if (!pt->context->system_ops->attach) {
			lwsl_err("%s: define (*attach)\n", __func__);
			return 1;
		}

		/*
		 * System locking is applied only around this next call, while
		 * we detach and get a pointer to the tail attach item.  We
		 * become responsible to free what we have detached.
		 */

		if (pt->context->system_ops->attach(pt->context, pt->tid, NULL,
						    0, NULL, &item)) {
			lwsl_err("%s: attach problem\n", __func__);
			return 1;
		}

		if (!item)
			/* there's nothing more to do at the moment */
			return 0;

		/*
		 * Do the callback from the lws event loop thread
		 */

		item->cb(pt->context, pt->tid, item->opaque);

		/* it's done, destroy the item */

		lws_free(item);
	}

	return 0;
}